

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O2

void OPSG_Mix(void *chip,UINT32 nSample,DEV_SMPL **pDst)

{
  ulong uVar1;
  DEV_SMPL *pDVar2;
  DEV_SMPL *pDVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar14;
  double dVar15;
  
  pDVar2 = *pDst;
  pDVar3 = pDst[1];
  uVar9 = 0;
  do {
    if (uVar9 == nSample) {
      return;
    }
    lVar10 = -0x114;
    lVar8 = 0;
    auVar12 = (undefined1  [16])0x0;
    while( true ) {
      iVar13 = auVar12._4_4_;
      iVar4 = auVar12._0_4_;
      if (lVar8 == 6) break;
      if ((*(char *)((long)chip + lVar10 * 4 + 0x474) != '\0') &&
         (((lVar8 != 1 || (*(int *)((long)chip + 0x634) == 0)) &&
          (*(char *)((long)chip + lVar8 + 0x650) == '\0')))) {
        if (*(char *)((long)chip + lVar10 * 4 + 0x475) == '\0') {
          if (*(char *)((long)chip + lVar10 * 4 + 0x51c) == '\0') {
            iVar5 = *(int *)((long)chip + lVar10 * 4 + 0x518);
            if (iVar5 != 0) {
              uVar7 = *(uint *)((long)chip + lVar10 * 4 + 0x514);
              iVar6 = *(int *)((long)chip + (ulong)(uVar7 >> 0x1b) * 4 + lVar10 * 4 + 0x48c);
              if ((lVar8 == 0) && (*(int *)((long)chip + 0x634) != 0)) {
                dVar15 = *(double *)((long)chip + 0x18) * 134217728.0;
                *(int *)((long)chip + 0xc4) =
                     *(int *)((long)chip + 0xc4) +
                     (int)(long)(dVar15 / (double)(uint)((*(int *)((long)chip +
                                                                  (ulong)(*(uint *)((long)chip +
                                                                                   0x17c) >> 0x1b) *
                                                                  4 + 0xf4) <<
                                                         ((char)*(int *)((long)chip + 0x634) *
                                                          '\x02' - 2U & 0x1f)) +
                                                        *(int *)((long)chip + 0x20)) + 0.5);
                *(uint *)((long)chip + 0x17c) =
                     (int)(long)(dVar15 / (double)(uint)(*(int *)((long)chip + 0x62c) *
                                                        *(int *)((long)chip + 0xd8)) + 0.5) +
                     *(uint *)((long)chip + 0x17c);
              }
              else {
                *(uint *)((long)chip + lVar10 * 4 + 0x514) = uVar7 + iVar5;
              }
              iVar5 = iVar6 >> 2;
              if (0x7f < *(uint *)((long)chip + lVar10 * 4 + 0x470)) {
                iVar5 = 0;
              }
              uVar7 = iVar6 - iVar5;
              uVar1 = *(ulong *)((long)chip + lVar10 * 4 + 0x484);
              auVar12._0_4_ = iVar4 + (int)((ulong)uVar7 * (uVar1 & 0xffffffff));
              auVar12._4_4_ = iVar13 + (int)((uVar1 >> 0x20) * (ulong)uVar7);
            }
          }
          else {
            uVar7 = *(uint *)((long)chip + lVar10 * 4 + 0x514);
            iVar5 = _NoiseTable[uVar7 >> 0x11];
            *(uint *)((long)chip + lVar10 * 4 + 0x514) =
                 uVar7 + *(int *)((long)chip + lVar10 * 4 + 0x524);
            iVar6 = *(int *)((long)chip + lVar10 * 4 + 0x484) * iVar5;
            if (*(int *)((long)chip + lVar10 * 4 + 0x520) != 0) {
              iVar5 = iVar5 * *(int *)((long)chip + lVar10 * 4 + 0x488);
              uVar14 = CONCAT44(iVar5 + iVar13 + (iVar5 >> 0xb) + (iVar5 >> 0xf) + (iVar5 >> 0xe),
                                iVar6 + iVar4 + (iVar6 >> 0xb) + (iVar6 >> 0xf) + (iVar6 >> 0xe));
              goto LAB_00150f59;
            }
            iVar5 = iVar5 * *(int *)((long)chip + lVar10 * 4 + 0x488);
            auVar12._0_4_ = (iVar6 >> 0xc) + iVar4 + (iVar6 >> 0xe) + (iVar6 >> 1);
            auVar12._4_4_ = (iVar5 >> 0xc) + iVar13 + (iVar5 >> 0xe) + (iVar5 >> 1);
          }
        }
        else {
          uVar1 = *(ulong *)((long)chip + lVar10 * 4 + 0x484);
          uVar7 = *(uint *)((long)chip + lVar10 * 4 + 0x510);
          iVar5 = (int)((uVar1 & 0xffffffff) * (ulong)uVar7);
          iVar6 = (int)((uVar1 >> 0x20) * (ulong)uVar7);
          uVar14 = CONCAT44(iVar6 + iVar13 + (iVar6 >> 3) + (iVar6 >> 5) + (iVar6 >> 4) +
                            (iVar6 >> 0xe) + (iVar6 >> 0xc) + (iVar6 >> 7) + (iVar6 >> 0xf),
                            iVar5 + iVar4 + (iVar5 >> 3) + (iVar5 >> 5) + (iVar5 >> 4) +
                            (iVar5 >> 0xe) + (iVar5 >> 0xc) + (iVar5 >> 7) + (iVar5 >> 0xf));
LAB_00150f59:
          auVar12._0_8_ = uVar14;
        }
      }
      iVar4 = *(int *)((long)chip + lVar8 * 4 + 0x5e0);
      iVar13 = -1;
      if (iVar4 < 1) {
        iVar5 = 0;
        iVar13 = 1;
        if (iVar4 < 0) goto LAB_00150f6c;
      }
      else {
LAB_00150f6c:
        iVar5 = iVar4 + iVar13;
        *(int *)((long)chip + lVar8 * 4 + 0x5e0) = iVar5;
      }
      iVar4 = *(int *)((long)chip + lVar8 * 4 + 0x600);
      iVar13 = -1;
      if ((0 < iVar4) || (iVar6 = 0, iVar13 = 1, iVar4 < 0)) {
        iVar6 = iVar4 + iVar13;
        *(int *)((long)chip + lVar8 * 4 + 0x600) = iVar6;
      }
      auVar11._0_4_ = auVar12._0_4_ + iVar5;
      auVar11._4_4_ = auVar12._4_4_ + iVar6;
      auVar11._8_4_ = auVar12._8_4_;
      auVar11._12_4_ = auVar12._12_4_;
      lVar8 = lVar8 + 1;
      lVar10 = lVar10 + 0x2e;
      auVar12 = auVar11;
    }
    dVar15 = *(double *)((long)chip + 0x648);
    pDVar2[uVar9] = (int)((double)iVar4 * dVar15);
    pDVar3[uVar9] = (int)((double)iVar13 * dVar15);
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static void
OPSG_Mix(
	void*		chip,
	UINT32		nSample,	// 書き出すサンプル数
	DEV_SMPL**	pDst)		// 出力先バッファ //Kitao更新。PSG専用バッファにしたためSint16に。
{
	huc6280_state* info = (huc6280_state*)chip;
	PSG*		PSGChn;
	Sint32		i;
	Uint32		j;
	Sint32		sample; //Kitao追加
	Sint32		sampleAllL; //Kitao追加。6chぶんのサンプルを足していくためのバッファ。精度を維持するために必要。6chぶん合計が終わった後に、これをSint16に変換して書き込むようにした。
	Sint32		sampleAllR; //Kitao追加。上のＲチャンネル用
	Sint32		smp; //Kitao追加。DDA音量,ノイズ音量計算用
	DEV_SMPL*	bufL = pDst[0];
	DEV_SMPL*	bufR = pDst[1];

	for (j=0; j<nSample; j++)
	{
		sampleAllL = 0;
		sampleAllR = 0;
		for (i=0; i<N_CHANNEL; i++)
		{
			PSGChn = &info->Psg[i];
			
			if ((PSGChn->bOn)&&((i != 1)||(info->LfoCtrl == 0))&&(!info->bPsgMute[i])) //Kitao更新
			{
				if (PSGChn->bDDA)
				{
					smp = PSGChn->ddaSample * PSGChn->outVolumeL;
					//smp = PSGChn->ddaSample * PSGChn->outVolumeL * (Sint32)OVERSAMPLE_RATE; //オーバーサンプリング用
					sampleAllL += smp + (smp >> 3) + (smp >> 4) + (smp >> 5) + (smp >> 7) + (smp >> 12) + (smp >> 14) + (smp >> 15); //Kitao更新。サンプリング音の音量を実機並みに調整。v2.39,v2.40,v2.62,v2.65再調整した。
					smp = PSGChn->ddaSample * PSGChn->outVolumeR;
					//smp = PSGChn->ddaSample * PSGChn->outVolumeR * (Sint32)OVERSAMPLE_RATE; //オーバーサンプリング用
					sampleAllR += smp + (smp >> 3) + (smp >> 4) + (smp >> 5) + (smp >> 7) + (smp >> 12) + (smp >> 14) + (smp >> 15); //Kitao更新。サンプリング音の音量を実機並みに調整。v2.39,v2.40,v2.62,v2.65再調整した。
				}
				else if (PSGChn->bNoiseOn)
				{
					sample = _NoiseTable[PSGChn->phase >> 17];
					PSGChn->phase += PSGChn->deltaNoisePhase; //Kitao更新
					/*
					for (k = 2; k<=OVERSAMPLE_RATE; k++) //オーバーサンプリング用
					{
						sample += _NoiseTable[PSGChn->phase>>17];
						PSGChn->phase += PSGChn->deltaNoisePhase;
					}
					*/
					
					if (PSGChn->noiseFrq == 0) //Kitao追加。noiseFrq=0(dataに0x1Fが書き込まれた)のときは音量が通常の半分とした。（ファイヤープロレスリング３、パックランド、桃太郎活劇、がんばれゴルフボーイズなど）
					{
						smp = sample * PSGChn->outVolumeL;
						sampleAllL += (smp >> 1) + (smp >> 12) + (smp >> 14); //(1/2 + 1/4096 + (1/32768 + 1/32768))
						smp = sample * PSGChn->outVolumeR;
						sampleAllR += (smp >> 1) + (smp >> 12) + (smp >> 14);
					}
					else //通常
					{
						smp = sample * PSGChn->outVolumeL;
						sampleAllL += smp + (smp >> 11) + (smp >> 14) + (smp >> 15); //Kitao更新。ノイズの音量を実機並みに調整(1 + 1/2048 + 1/16384 + 1/32768)。この"+1/32768"で絶妙(主観。大魔界村,ソルジャーブレイドなど)になる。v2.62更新
						smp = sample * PSGChn->outVolumeR;
						sampleAllR += smp + (smp >> 11) + (smp >> 14) + (smp >> 15); //Kitao更新。ノイズの音量を実機並みに調整
					}
				}
				else if (PSGChn->deltaPhase)
				{
					//Kitao更新。オーバーサンプリングしないようにした。
					sample = PSGChn->wave[PSGChn->phase >> 27];
					inc_phase(info, i); //v2.73更新
					/*
					for (k = 2; k<=OVERSAMPLE_RATE; k++) //オーバーサンプリング用
					{
						sample += PSGChn->wave[PSGChn->phase >> 27];
						inc_phase(i); //v2.73更新
					}
					*/
					if (PSGChn->frq < 128)
						sample -= sample >> 2; //低周波域の音量を制限。ブラッドギアのスタート時などで実機と同様の音に。ソルジャーブレイドなども実機に近くなった。v2.03

					sampleAllL += sample * PSGChn->outVolumeL; //Kitao更新
					sampleAllR += sample * PSGChn->outVolumeR; //Kitao更新
				}
			}
			//Kitao追加。DDA消音時はノイズ軽減のためフェードアウトで消音する。
			//			 ベラボーマン(「わしがばくだはかせじゃ」から数秒後)やパワーテニス(タイトル曲終了から数秒後。点数コール)，将棋初心者無用(音声)等で効果あり。
			if (info->DdaFadeOutL[i] > 0)
				--info->DdaFadeOutL[i];
			else if (info->DdaFadeOutL[i] < 0)
				++info->DdaFadeOutL[i];
			if (info->DdaFadeOutR[i] > 0)
				--info->DdaFadeOutR[i];
			else if (info->DdaFadeOutR[i] < 0)
				++info->DdaFadeOutR[i];
			sampleAllL += info->DdaFadeOutL[i];
			//sampleAllL += info->DdaFadeOutL[i] * OVERSAMPLE_RATE; //オーバーサンプリング用
			sampleAllR += info->DdaFadeOutR[i];
			//sampleAllR += info->DdaFadeOutR[i] * OVERSAMPLE_RATE; //オーバーサンプリング用
		}
		//Kitao更新。6ch合わさったところで、ボリューム調整してバッファに書き込む。
		bufL[j] = (DEV_SMPL)((double)sampleAllL * info->VOL);
		bufR[j] = (DEV_SMPL)((double)sampleAllR * info->VOL);
		
#ifdef ENABLE_QUEUE
		//キューを参照しPSGレジスタを更新する。Kitao更新。高速化のためサブルーチンにせずここで処理。キューの参照はシンプルにした(テンポの安定性向上)。
		while (_QueueReadIndex != _QueueWriteIndex) //v1.10更新。キュー処理をここへ統合し高速化。
		{
			write_reg(_Queue[_QueueReadIndex].reg, _Queue[_QueueReadIndex].data);
			_QueueReadIndex++; //Kitao更新
			_QueueReadIndex &= APUQUEUE_SIZE-1; //Kitao更新
		}
#endif
	}
}